

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceArrayIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  AccelData *pAVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined4 in_EAX;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  Intersectors *pIVar23;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar24;
  size_t sVar25;
  size_t sVar26;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar27;
  size_t sVar28;
  undefined4 uVar29;
  Intersectors *pIVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  undefined1 auVar42 [12];
  float fVar51;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [12];
  float fVar79;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [12];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [12];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  vbool<4> vVar144;
  Precalculations pre;
  ulong local_1190;
  vbool<4> valid0;
  undefined1 local_1148 [16];
  undefined1 local_1118 [16];
  undefined1 local_1098 [16];
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_f88;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar77 [16];
  undefined1 auVar114 [16];
  
  auVar141._8_4_ = 0xffffffff;
  auVar141._0_8_ = 0xffffffffffffffff;
  auVar141._12_4_ = 0xffffffff;
  auVar44._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar44._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar44._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar44._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar20 = movmskps(in_EAX,auVar44);
  if (uVar20 == 0) {
    return;
  }
  local_1088 = (valid_i->field_0).i[0];
  iStack_1084 = (valid_i->field_0).i[1];
  iStack_1080 = (valid_i->field_0).i[2];
  iStack_107c = (valid_i->field_0).i[3];
  pAVar4 = This->ptr;
  auVar141 = auVar44 ^ auVar141;
  fVar8 = *(float *)ray;
  fVar9 = *(float *)(ray + 4);
  fVar10 = *(float *)(ray + 8);
  fVar11 = *(float *)(ray + 0xc);
  fVar12 = *(float *)(ray + 0x10);
  fVar13 = *(float *)(ray + 0x14);
  fVar14 = *(float *)(ray + 0x18);
  fVar15 = *(float *)(ray + 0x1c);
  fVar16 = *(float *)(ray + 0x20);
  fVar17 = *(float *)(ray + 0x24);
  fVar18 = *(float *)(ray + 0x28);
  fVar19 = *(float *)(ray + 0x2c);
  fVar41 = *(float *)(ray + 0x40);
  fVar51 = *(float *)(ray + 0x44);
  fVar60 = *(float *)(ray + 0x48);
  fVar79 = *(float *)(ray + 0x4c);
  fVar87 = (float)DAT_01ff1d40;
  fVar95 = DAT_01ff1d40._4_4_;
  fVar96 = DAT_01ff1d40._8_4_;
  fVar97 = DAT_01ff1d40._12_4_;
  auVar90._0_4_ = (uint)fVar41 & -(uint)(fVar87 <= ABS(fVar41));
  auVar90._4_4_ = (uint)fVar51 & -(uint)(fVar95 <= ABS(fVar51));
  auVar90._8_4_ = (uint)fVar60 & -(uint)(fVar96 <= ABS(fVar60));
  auVar90._12_4_ = (uint)fVar79 & -(uint)(fVar97 <= ABS(fVar79));
  auVar73._0_4_ = ~-(uint)(fVar87 <= ABS(fVar41)) & (uint)fVar87;
  auVar73._4_4_ = ~-(uint)(fVar95 <= ABS(fVar51)) & (uint)fVar95;
  auVar73._8_4_ = ~-(uint)(fVar96 <= ABS(fVar60)) & (uint)fVar96;
  auVar73._12_4_ = ~-(uint)(fVar97 <= ABS(fVar79)) & (uint)fVar97;
  auVar73 = auVar73 | auVar90;
  uVar37 = -(uint)(fVar87 <= ABS(*(float *)(ray + 0x50)));
  uVar38 = -(uint)(fVar95 <= ABS(*(float *)(ray + 0x54)));
  uVar39 = -(uint)(fVar96 <= ABS(*(float *)(ray + 0x58)));
  uVar40 = -(uint)(fVar97 <= ABS(*(float *)(ray + 0x5c)));
  auVar100._0_4_ = (uint)*(float *)(ray + 0x50) & uVar37;
  auVar100._4_4_ = (uint)*(float *)(ray + 0x54) & uVar38;
  auVar100._8_4_ = (uint)*(float *)(ray + 0x58) & uVar39;
  auVar100._12_4_ = (uint)*(float *)(ray + 0x5c) & uVar40;
  auVar81._0_4_ = ~uVar37 & (uint)fVar87;
  auVar81._4_4_ = ~uVar38 & (uint)fVar95;
  auVar81._8_4_ = ~uVar39 & (uint)fVar96;
  auVar81._12_4_ = ~uVar40 & (uint)fVar97;
  auVar81 = auVar81 | auVar100;
  uVar37 = -(uint)(fVar87 <= ABS(*(float *)(ray + 0x60)));
  uVar38 = -(uint)(fVar95 <= ABS(*(float *)(ray + 100)));
  uVar39 = -(uint)(fVar96 <= ABS(*(float *)(ray + 0x68)));
  uVar40 = -(uint)(fVar97 <= ABS(*(float *)(ray + 0x6c)));
  auVar101._0_4_ = (uint)*(float *)(ray + 0x60) & uVar37;
  auVar101._4_4_ = (uint)*(float *)(ray + 100) & uVar38;
  auVar101._8_4_ = (uint)*(float *)(ray + 0x68) & uVar39;
  auVar101._12_4_ = (uint)*(float *)(ray + 0x6c) & uVar40;
  auVar61._0_4_ = ~uVar37 & (uint)fVar87;
  auVar61._4_4_ = ~uVar38 & (uint)fVar95;
  auVar61._8_4_ = ~uVar39 & (uint)fVar96;
  auVar61._12_4_ = ~uVar40 & (uint)fVar97;
  auVar61 = auVar61 | auVar101;
  auVar88 = rcpps(_DAT_01ff1d40,auVar73);
  fVar125 = auVar88._0_4_;
  auVar127._0_4_ = auVar73._0_4_ * fVar125;
  fVar133 = auVar88._4_4_;
  auVar127._4_4_ = auVar73._4_4_ * fVar133;
  fVar134 = auVar88._8_4_;
  auVar127._8_4_ = auVar73._8_4_ * fVar134;
  fVar135 = auVar88._12_4_;
  auVar127._12_4_ = auVar73._12_4_ * fVar135;
  auVar102._8_4_ = 0xffffffff;
  auVar102._0_8_ = 0xffffffffffffffff;
  auVar102._12_4_ = 0xffffffff;
  fVar125 = (1.0 - auVar127._0_4_) * fVar125 + fVar125;
  fVar133 = (1.0 - auVar127._4_4_) * fVar133 + fVar133;
  fVar134 = (1.0 - auVar127._8_4_) * fVar134 + fVar134;
  fVar135 = (1.0 - auVar127._12_4_) * fVar135 + fVar135;
  auVar88 = rcpps(auVar127,auVar81);
  fVar87 = auVar88._0_4_;
  fVar96 = auVar88._4_4_;
  fVar138 = auVar88._8_4_;
  fVar139 = auVar88._12_4_;
  fVar87 = (1.0 - auVar81._0_4_ * fVar87) * fVar87 + fVar87;
  fVar96 = (1.0 - auVar81._4_4_ * fVar96) * fVar96 + fVar96;
  fVar138 = (1.0 - auVar81._8_4_ * fVar138) * fVar138 + fVar138;
  fVar139 = (1.0 - auVar81._12_4_ * fVar139) * fVar139 + fVar139;
  auVar88 = rcpps(auVar88,auVar61);
  fVar95 = auVar88._0_4_;
  fVar97 = auVar88._4_4_;
  fVar123 = auVar88._8_4_;
  fVar124 = auVar88._12_4_;
  fVar95 = (1.0 - auVar61._0_4_ * fVar95) * fVar95 + fVar95;
  fVar97 = (1.0 - auVar61._4_4_ * fVar97) * fVar97 + fVar97;
  fVar123 = (1.0 - auVar61._8_4_ * fVar123) * fVar123 + fVar123;
  fVar124 = (1.0 - auVar61._12_4_ * fVar124) * fVar124 + fVar124;
  auVar82._0_12_ = ZEXT812(0);
  auVar82._12_4_ = 0;
  local_1068 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar82);
  auVar88._0_8_ = CONCAT44(-(uint)(fVar51 < 0.0),-(uint)(fVar41 < 0.0)) & 0x100000001;
  auVar88._8_4_ = -(uint)(fVar60 < 0.0) & 1;
  auVar88._12_4_ = -(uint)(fVar79 < 0.0) & 1;
  auVar105._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
       0x200000002;
  auVar105._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
  auVar105._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
  auVar130._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
       0x400000004;
  auVar130._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
  auVar130._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
  local_1078 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar82);
  local_1098 = auVar44 ^ auVar102 | auVar88 | auVar130 | auVar105;
  pIVar23 = (Intersectors *)(ulong)(uVar20 & 0xff);
LAB_002116a2:
  pSVar24 = stack + 1;
  lVar5 = 0;
  if (pIVar23 != (Intersectors *)0x0) {
    for (; ((ulong)pIVar23 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  iVar21 = *(int *)(local_1098 + lVar5 * 4);
  local_1148._0_4_ = -(uint)(iVar21 == local_1098._0_4_);
  local_1148._4_4_ = -(uint)(iVar21 == local_1098._4_4_);
  local_1148._8_4_ = -(uint)(iVar21 == local_1098._8_4_);
  local_1148._12_4_ = -(uint)(iVar21 == local_1098._12_4_);
  auVar6._4_4_ = local_1148._4_4_;
  auVar6._0_4_ = local_1148._0_4_;
  auVar6._8_4_ = local_1148._8_4_;
  auVar6._12_4_ = local_1148._12_4_;
  auVar61 = ~auVar6 & _DAT_01feb9f0;
  auVar53._0_8_ = CONCAT44((uint)fVar133 & local_1148._4_4_,(uint)fVar125 & local_1148._0_4_);
  auVar53._8_4_ = (uint)fVar134 & local_1148._8_4_;
  auVar53._12_4_ = (uint)fVar135 & local_1148._12_4_;
  auVar62._8_4_ = auVar53._8_4_;
  auVar62._0_8_ = auVar53._0_8_;
  auVar62._12_4_ = auVar53._12_4_;
  auVar62 = auVar62 | auVar61;
  auVar43._4_4_ = auVar62._0_4_;
  auVar43._0_4_ = auVar62._4_4_;
  auVar43._8_4_ = auVar62._12_4_;
  auVar43._12_4_ = auVar62._8_4_;
  auVar44 = minps(auVar43,auVar62);
  auVar74._0_8_ = CONCAT44((uint)fVar96 & local_1148._4_4_,(uint)fVar87 & local_1148._0_4_);
  auVar74._8_4_ = (uint)fVar138 & local_1148._8_4_;
  auVar74._12_4_ = (uint)fVar139 & local_1148._12_4_;
  auVar63._8_4_ = auVar74._8_4_;
  auVar63._0_8_ = auVar74._0_8_;
  auVar63._12_4_ = auVar74._12_4_;
  auVar63 = auVar63 | auVar61;
  auVar89._4_4_ = auVar63._0_4_;
  auVar89._0_4_ = auVar63._4_4_;
  auVar89._8_4_ = auVar63._12_4_;
  auVar89._12_4_ = auVar63._8_4_;
  auVar90 = minps(auVar89,auVar63);
  auVar103._0_8_ = CONCAT44((uint)fVar97 & local_1148._4_4_,(uint)fVar95 & local_1148._0_4_);
  auVar103._8_4_ = (uint)fVar123 & local_1148._8_4_;
  auVar103._12_4_ = (uint)fVar124 & local_1148._12_4_;
  auVar64._8_4_ = auVar103._8_4_;
  auVar64._0_8_ = auVar103._0_8_;
  auVar64._12_4_ = auVar103._12_4_;
  auVar64 = auVar64 | auVar61;
  auVar112._4_4_ = auVar64._0_4_;
  auVar112._0_4_ = auVar64._4_4_;
  auVar112._8_4_ = auVar64._12_4_;
  auVar112._12_4_ = auVar64._8_4_;
  auVar88 = minps(auVar112,auVar64);
  auVar65._0_8_ = auVar88._8_8_;
  auVar65._8_4_ = auVar88._0_4_;
  auVar65._12_4_ = auVar88._4_4_;
  auVar88 = minps(auVar65,auVar88);
  auVar114._0_8_ = auVar44._0_8_;
  auVar114._8_4_ = auVar44._4_4_;
  auVar114._12_4_ = auVar90._4_4_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._0_4_ = auVar44._0_4_;
  auVar113._4_4_ = auVar90._0_4_;
  auVar45._4_4_ = auVar90._8_4_;
  auVar45._0_4_ = auVar44._8_4_;
  auVar45._8_4_ = auVar44._12_4_;
  auVar45._12_4_ = auVar90._12_4_;
  auVar44 = minps(auVar45,auVar113);
  fVar60 = auVar88._0_4_;
  fVar41 = auVar44._0_4_;
  fVar51 = auVar44._4_4_;
  auVar91._0_8_ = CONCAT44(~local_1148._4_4_,~local_1148._0_4_) & 0xff800000ff800000;
  auVar91._8_4_ = ~local_1148._8_4_ & 0xff800000;
  auVar91._12_4_ = ~local_1148._12_4_ & 0xff800000;
  auVar53 = auVar53 | auVar91;
  auVar66._4_4_ = auVar53._0_4_;
  auVar66._0_4_ = auVar53._4_4_;
  auVar66._8_4_ = auVar53._12_4_;
  auVar66._12_4_ = auVar53._8_4_;
  auVar88 = maxps(auVar66,auVar53);
  auVar74 = auVar74 | auVar91;
  auVar54._4_4_ = auVar74._0_4_;
  auVar54._0_4_ = auVar74._4_4_;
  auVar54._8_4_ = auVar74._12_4_;
  auVar54._12_4_ = auVar74._8_4_;
  auVar44 = maxps(auVar54,auVar74);
  auVar103 = auVar103 | auVar91;
  auVar75._4_4_ = auVar103._0_4_;
  auVar75._0_4_ = auVar103._4_4_;
  auVar75._8_4_ = auVar103._12_4_;
  auVar75._12_4_ = auVar103._8_4_;
  auVar90 = maxps(auVar75,auVar103);
  auVar104._0_8_ = auVar90._8_8_;
  auVar104._8_4_ = auVar90._0_4_;
  auVar104._12_4_ = auVar90._4_4_;
  auVar105 = maxps(auVar104,auVar90);
  auVar77._0_8_ = auVar88._0_8_;
  auVar77._8_4_ = auVar88._4_4_;
  auVar77._12_4_ = auVar44._4_4_;
  auVar76._8_8_ = auVar77._8_8_;
  auVar76._0_4_ = auVar88._0_4_;
  auVar76._4_4_ = auVar44._0_4_;
  auVar67._4_4_ = auVar44._8_4_;
  auVar67._0_4_ = auVar88._8_4_;
  auVar67._8_4_ = auVar88._12_4_;
  auVar67._12_4_ = auVar44._12_4_;
  auVar44 = maxps(auVar67,auVar76);
  uVar20 = -(uint)(fVar41 < 0.0);
  uVar37 = -(uint)(fVar51 < 0.0);
  uVar38 = -(uint)(fVar60 < 0.0);
  auVar98._0_4_ = ~uVar20 & (uint)fVar41;
  auVar98._4_4_ = ~uVar37 & (uint)fVar51;
  auVar98._8_4_ = ~uVar38 & (uint)fVar60;
  auVar72._0_4_ = auVar44._0_4_ & uVar20;
  auVar72._4_4_ = auVar44._4_4_ & uVar37;
  auVar72._8_4_ = auVar105._0_4_ & uVar38;
  auVar72 = auVar72 | auVar98;
  local_fd8 = auVar72._0_4_;
  fVar79 = auVar72._4_4_;
  local_1008 = auVar72._8_4_;
  uVar33 = (ulong)(fVar79 < 0.0) << 4 | 0x20;
  auVar142._0_4_ = local_1068._0_4_ & local_1148._0_4_;
  auVar142._4_4_ = local_1068._4_4_ & local_1148._4_4_;
  auVar142._8_4_ = local_1068._8_4_ & local_1148._8_4_;
  auVar142._12_4_ = local_1068._12_4_ & local_1148._12_4_;
  uVar35 = (ulong)(local_1008 < 0.0) << 4 | 0x40;
  uVar34 = uVar33 ^ 0x10;
  auVar142 = auVar142 | auVar61;
  auVar106._0_8_ = CONCAT44((uint)fVar9 & local_1148._4_4_,(uint)fVar8 & local_1148._0_4_);
  auVar106._8_4_ = (uint)fVar10 & local_1148._8_4_;
  auVar106._12_4_ = (uint)fVar11 & local_1148._12_4_;
  auVar115._8_4_ = auVar106._8_4_;
  auVar115._0_8_ = auVar106._0_8_;
  auVar115._12_4_ = auVar106._12_4_;
  auVar115 = auVar115 | auVar91;
  auVar120._4_4_ = auVar115._0_4_;
  auVar120._0_4_ = auVar115._4_4_;
  auVar120._8_4_ = auVar115._12_4_;
  auVar120._12_4_ = auVar115._8_4_;
  auVar88 = maxps(auVar120,auVar115);
  auVar126._0_8_ = auVar88._8_8_;
  auVar126._8_4_ = auVar88._0_4_;
  auVar126._12_4_ = auVar88._4_4_;
  auVar127 = maxps(auVar126,auVar88);
  auVar116._0_8_ = CONCAT44((uint)fVar13 & local_1148._4_4_,(uint)fVar12 & local_1148._0_4_);
  auVar116._8_4_ = (uint)fVar14 & local_1148._8_4_;
  auVar116._12_4_ = (uint)fVar15 & local_1148._12_4_;
  auVar121._8_4_ = auVar116._8_4_;
  auVar121._0_8_ = auVar116._0_8_;
  auVar121._12_4_ = auVar116._12_4_;
  auVar121 = auVar121 | auVar91;
  auVar136._4_4_ = auVar121._0_4_;
  auVar136._0_4_ = auVar121._4_4_;
  auVar136._8_4_ = auVar121._12_4_;
  auVar136._12_4_ = auVar121._8_4_;
  auVar88 = maxps(auVar136,auVar121);
  auVar143._0_8_ = auVar88._8_8_;
  auVar143._8_4_ = auVar88._0_4_;
  auVar143._12_4_ = auVar88._4_4_;
  auVar81 = maxps(auVar143,auVar88);
  auVar122._0_8_ = CONCAT44((uint)fVar17 & local_1148._4_4_,(uint)fVar16 & local_1148._0_4_);
  auVar122._8_4_ = (uint)fVar18 & local_1148._8_4_;
  auVar122._12_4_ = (uint)fVar19 & local_1148._12_4_;
  auVar128._8_4_ = auVar122._8_4_;
  auVar128._0_8_ = auVar122._0_8_;
  auVar128._12_4_ = auVar122._12_4_;
  auVar128 = auVar128 | auVar91;
  auVar137._4_4_ = auVar128._0_4_;
  auVar137._0_4_ = auVar128._4_4_;
  auVar137._8_4_ = auVar128._12_4_;
  auVar137._12_4_ = auVar128._8_4_;
  auVar88 = maxps(auVar137,auVar128);
  auVar129._0_8_ = auVar88._8_8_;
  auVar129._8_4_ = auVar88._0_4_;
  auVar129._12_4_ = auVar88._4_4_;
  auVar130 = maxps(auVar129,auVar88);
  auVar106 = auVar106 | auVar61;
  auVar131._4_4_ = auVar106._0_4_;
  auVar131._0_4_ = auVar106._4_4_;
  auVar131._8_4_ = auVar106._12_4_;
  auVar131._12_4_ = auVar106._8_4_;
  auVar88 = minps(auVar131,auVar106);
  auVar107._0_8_ = auVar88._8_8_;
  auVar107._8_4_ = auVar88._0_4_;
  auVar107._12_4_ = auVar88._4_4_;
  auVar90 = minps(auVar107,auVar88);
  auVar116 = auVar116 | auVar61;
  auVar132._4_4_ = auVar116._0_4_;
  auVar132._0_4_ = auVar116._4_4_;
  auVar132._8_4_ = auVar116._12_4_;
  auVar132._12_4_ = auVar116._8_4_;
  auVar88 = minps(auVar132,auVar116);
  auVar117._0_8_ = auVar88._8_8_;
  auVar117._8_4_ = auVar88._0_4_;
  auVar117._12_4_ = auVar88._4_4_;
  auVar73 = minps(auVar117,auVar88);
  auVar122 = auVar122 | auVar61;
  auVar83._4_4_ = auVar122._0_4_;
  auVar83._0_4_ = auVar122._4_4_;
  auVar83._8_4_ = auVar122._12_4_;
  auVar83._12_4_ = auVar122._8_4_;
  auVar88 = minps(auVar83,auVar122);
  auVar108._0_8_ = auVar88._8_8_;
  auVar108._8_4_ = auVar88._0_4_;
  auVar108._12_4_ = auVar88._4_4_;
  auVar88 = minps(auVar108,auVar88);
  auVar80._0_4_ = ~uVar20 & auVar90._0_4_;
  auVar80._4_4_ = ~uVar37 & auVar73._0_4_;
  auVar80._8_4_ = ~uVar38 & auVar88._0_4_;
  auVar99._0_4_ = ~uVar20 & auVar127._0_4_;
  auVar99._4_4_ = ~uVar37 & auVar81._0_4_;
  auVar99._8_4_ = ~uVar38 & auVar130._0_4_;
  auVar140._0_4_ = auVar127._0_4_ & uVar20;
  auVar140._4_4_ = auVar81._0_4_ & uVar37;
  auVar140._8_4_ = auVar130._0_4_ & uVar38;
  auVar140 = auVar140 | auVar80;
  auVar111._0_4_ = auVar90._0_4_ & uVar20;
  auVar111._4_4_ = auVar73._0_4_ & uVar37;
  auVar111._8_4_ = auVar88._0_4_ & uVar38;
  auVar111 = auVar111 | auVar99;
  local_1118._0_4_ = local_1078._0_4_ & local_1148._0_4_;
  local_1118._4_4_ = local_1078._4_4_ & local_1148._4_4_;
  local_1118._8_4_ = local_1078._8_4_ & local_1148._8_4_;
  local_1118._12_4_ = local_1078._12_4_ & local_1148._12_4_;
  local_1118 = local_1118 | auVar91;
  auVar84._4_4_ = local_1118._0_4_;
  auVar84._0_4_ = local_1118._4_4_;
  auVar84._8_4_ = local_1118._12_4_;
  auVar84._12_4_ = local_1118._8_4_;
  auVar88 = maxps(auVar84,local_1118);
  auVar92._4_4_ = auVar142._0_4_;
  auVar92._0_4_ = auVar142._4_4_;
  auVar92._8_4_ = auVar142._12_4_;
  auVar92._12_4_ = auVar142._8_4_;
  auVar90 = minps(auVar92,auVar142);
  auVar7._4_4_ = local_1148._4_4_;
  auVar7._0_4_ = local_1148._0_4_;
  auVar7._8_4_ = local_1148._8_4_;
  auVar7._12_4_ = local_1148._12_4_;
  uVar29 = movmskps((int)This,auVar7);
  stack[0].mask = CONCAT44((int)((ulong)This >> 0x20),uVar29);
  stack[0].ptr.ptr = *(size_t *)&pAVar4[1].bounds.bounds0.lower.field_0;
  pIVar30 = (Intersectors *)(~stack[0].mask & (ulong)pIVar23);
  auVar42._0_4_ = (uint)fVar41 & uVar20;
  auVar42._4_4_ = (uint)fVar51 & uVar37;
  auVar42._8_4_ = (uint)fVar60 & uVar38;
  auVar52._0_4_ = ~uVar20 & auVar44._0_4_;
  auVar52._4_4_ = ~uVar37 & auVar44._4_4_;
  auVar52._8_4_ = ~uVar38 & auVar105._0_4_;
  auVar52 = auVar52 | auVar42;
  local_fe8 = auVar111._0_4_ * local_fd8;
  local_ff8 = auVar111._4_4_ * fVar79;
  fStack_fa0 = auVar111._8_4_ * local_1008;
  local_1018 = auVar52._0_4_;
  local_1028 = auVar140._0_4_ * local_1018;
  local_1048 = auVar52._4_4_;
  local_1038 = auVar140._4_4_ * local_1048;
  fVar41 = auVar52._8_4_;
  local_f98 = auVar140._8_4_ * fVar41;
  uVar32 = (ulong)(local_fd8 < 0.0) * 0x10;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_fa8._4_4_ = fStack_fa0;
  local_fa8._0_4_ = fStack_fa0;
  fStack_f9c = fStack_fa0;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  uVar29 = auVar90._0_4_;
  auVar93._8_4_ = auVar90._8_4_;
  auVar46._4_4_ = uVar29;
  auVar46._0_4_ = uVar29;
  auVar46._8_4_ = uVar29;
  auVar46._12_4_ = uVar29;
  auVar93._4_4_ = auVar93._8_4_;
  auVar93._0_4_ = auVar93._8_4_;
  auVar93._12_4_ = auVar93._8_4_;
  local_fc8 = minps(auVar93,auVar46);
  uVar29 = auVar88._0_4_;
  auVar85._8_4_ = auVar88._8_4_;
  auVar47._4_4_ = uVar29;
  auVar47._0_4_ = uVar29;
  auVar47._8_4_ = uVar29;
  auVar47._12_4_ = uVar29;
  auVar85._4_4_ = auVar85._8_4_;
  auVar85._0_4_ = auVar85._8_4_;
  auVar85._12_4_ = auVar85._8_4_;
  local_fb8 = maxps(auVar85,auVar47);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  local_1058._4_4_ = fVar41;
  local_1058._0_4_ = fVar41;
  fStack_1050 = fVar41;
  fStack_104c = fVar41;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  This = pIVar30;
LAB_00211a6a:
  if (pSVar24 != stack) {
    pSVar27 = pSVar24 + -1;
    uVar29 = movmskps((int)pIVar23,auVar141);
    uVar22 = ~CONCAT44((int)((ulong)pIVar23 >> 0x20),uVar29) & pSVar24[-1].mask;
    if (uVar22 != 0) {
      sVar28 = (pSVar27->ptr).ptr;
      do {
        if ((sVar28 & 8) != 0) {
          if (uVar22 != 0) {
            valid0.field_0._0_8_ = auVar141._0_8_ ^ 0xffffffffffffffff;
            valid0.field_0.i[2] = auVar141._8_4_ ^ 0xffffffff;
            valid0.field_0.i[3] = auVar141._12_4_ ^ 0xffffffff;
            uVar31 = (ulong)((uint)sVar28 & 0xf) - 8;
            uVar22 = uVar31;
            if (uVar31 == 0) goto LAB_00211cf7;
            local_1190 = 1;
            goto LAB_00211c98;
          }
          break;
        }
        pfVar2 = (float *)(sVar28 + 0x20 + uVar32);
        auVar48._0_4_ = *pfVar2 * local_fd8 - local_fe8;
        auVar48._4_4_ = pfVar2[1] * fStack_fd4 - fStack_fe4;
        auVar48._8_4_ = pfVar2[2] * fStack_fd0 - fStack_fe0;
        auVar48._12_4_ = pfVar2[3] * fStack_fcc - fStack_fdc;
        pfVar2 = (float *)(sVar28 + 0x20 + uVar33);
        auVar55._0_4_ = *pfVar2 * fVar79 - local_ff8;
        auVar55._4_4_ = pfVar2[1] * fVar79 - fStack_ff4;
        auVar55._8_4_ = pfVar2[2] * fVar79 - fStack_ff0;
        auVar55._12_4_ = pfVar2[3] * fVar79 - fStack_fec;
        auVar44 = maxps(auVar48,auVar55);
        pfVar2 = (float *)(sVar28 + 0x20 + uVar35);
        auVar56._0_4_ = *pfVar2 * local_1008 - (float)local_fa8._0_4_;
        auVar56._4_4_ = pfVar2[1] * fStack_1004 - (float)local_fa8._4_4_;
        auVar56._8_4_ = pfVar2[2] * fStack_1000 - fStack_fa0;
        auVar56._12_4_ = pfVar2[3] * fStack_ffc - fStack_f9c;
        auVar88 = maxps(auVar56,local_fc8);
        auVar44 = maxps(auVar44,auVar88);
        pfVar2 = (float *)(sVar28 + 0x20 + (uVar32 ^ 0x10));
        auVar57._0_4_ = *pfVar2 * local_1018 - local_1028;
        auVar57._4_4_ = pfVar2[1] * fStack_1014 - fStack_1024;
        auVar57._8_4_ = pfVar2[2] * fStack_1010 - fStack_1020;
        auVar57._12_4_ = pfVar2[3] * fStack_100c - fStack_101c;
        pfVar2 = (float *)(sVar28 + 0x20 + uVar34);
        auVar68._0_4_ = *pfVar2 * local_1048 - local_1038;
        auVar68._4_4_ = pfVar2[1] * fStack_1044 - fStack_1034;
        auVar68._8_4_ = pfVar2[2] * fStack_1040 - fStack_1030;
        auVar68._12_4_ = pfVar2[3] * fStack_103c - fStack_102c;
        auVar88 = minps(auVar57,auVar68);
        pfVar2 = (float *)(sVar28 + 0x20 + (uVar35 ^ 0x10));
        auVar69._0_4_ = *pfVar2 * (float)local_1058._0_4_ - local_f98;
        auVar69._4_4_ = pfVar2[1] * (float)local_1058._4_4_ - fStack_f94;
        auVar69._8_4_ = pfVar2[2] * fStack_1050 - fStack_f90;
        auVar69._12_4_ = pfVar2[3] * fStack_104c - fStack_f8c;
        auVar90 = minps(auVar69,local_fb8);
        auVar88 = minps(auVar88,auVar90);
        auVar49._4_4_ = -(uint)(auVar44._4_4_ <= auVar88._4_4_);
        auVar49._0_4_ = -(uint)(auVar44._0_4_ <= auVar88._0_4_);
        auVar49._8_4_ = -(uint)(auVar44._8_4_ <= auVar88._8_4_);
        auVar49._12_4_ = -(uint)(auVar44._12_4_ <= auVar88._12_4_);
        uVar20 = movmskps((int)uVar34,auVar49);
        if (uVar20 == 0) {
          This = (Intersectors *)0x0;
        }
        else {
          uVar31 = (ulong)(uVar20 & 0xff);
          uVar22 = 0;
          sVar25 = 8;
          do {
            lVar5 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            fVar41 = *(float *)(sVar28 + 0x20 + lVar5 * 4);
            fVar51 = *(float *)(sVar28 + 0x30 + lVar5 * 4);
            fVar60 = *(float *)(sVar28 + 0x40 + lVar5 * 4);
            fVar3 = *(float *)(sVar28 + 0x50 + lVar5 * 4);
            auVar50._0_8_ = CONCAT44((fVar41 - fVar9) * fVar133,(fVar41 - fVar8) * fVar125);
            auVar50._8_4_ = (fVar41 - fVar10) * fVar134;
            auVar50._12_4_ = (fVar41 - fVar11) * fVar135;
            auVar58._0_8_ = CONCAT44((fVar60 - fVar13) * fVar96,(fVar60 - fVar12) * fVar87);
            auVar58._8_4_ = (fVar60 - fVar14) * fVar138;
            auVar58._12_4_ = (fVar60 - fVar15) * fVar139;
            fVar41 = *(float *)(sVar28 + 0x60 + lVar5 * 4);
            auVar86._0_8_ = CONCAT44((fVar41 - fVar17) * fVar97,(fVar41 - fVar16) * fVar95);
            auVar86._8_4_ = (fVar41 - fVar18) * fVar123;
            auVar86._12_4_ = (fVar41 - fVar19) * fVar124;
            auVar70._0_4_ = (fVar51 - fVar8) * fVar125;
            auVar70._4_4_ = (fVar51 - fVar9) * fVar133;
            auVar70._8_4_ = (fVar51 - fVar10) * fVar134;
            auVar70._12_4_ = (fVar51 - fVar11) * fVar135;
            auVar78._0_4_ = (fVar3 - fVar12) * fVar87;
            auVar78._4_4_ = (fVar3 - fVar13) * fVar96;
            auVar78._8_4_ = (fVar3 - fVar14) * fVar138;
            auVar78._12_4_ = (fVar3 - fVar15) * fVar139;
            fVar41 = *(float *)(sVar28 + 0x70 + lVar5 * 4);
            auVar94._0_4_ = (fVar41 - fVar16) * fVar95;
            auVar94._4_4_ = (fVar41 - fVar17) * fVar97;
            auVar94._8_4_ = (fVar41 - fVar18) * fVar123;
            auVar94._12_4_ = (fVar41 - fVar19) * fVar124;
            auVar109._8_4_ = auVar50._8_4_;
            auVar109._0_8_ = auVar50._0_8_;
            auVar109._12_4_ = auVar50._12_4_;
            auVar44 = minps(auVar109,auVar70);
            auVar118._8_4_ = auVar58._8_4_;
            auVar118._0_8_ = auVar58._0_8_;
            auVar118._12_4_ = auVar58._12_4_;
            auVar88 = minps(auVar118,auVar78);
            auVar44 = maxps(auVar44,auVar88);
            auVar119._8_4_ = auVar86._8_4_;
            auVar119._0_8_ = auVar86._0_8_;
            auVar119._12_4_ = auVar86._12_4_;
            auVar88 = minps(auVar119,auVar94);
            auVar90 = maxps(auVar44,auVar88);
            auVar44 = maxps(auVar50,auVar70);
            auVar88 = maxps(auVar58,auVar78);
            auVar44 = minps(auVar44,auVar88);
            auVar88 = maxps(auVar86,auVar94);
            auVar44 = minps(auVar44,auVar88);
            auVar88 = maxps(auVar90,auVar142);
            auVar44 = minps(auVar44,local_1118);
            auVar110._4_4_ = -(uint)(auVar88._4_4_ <= auVar44._4_4_);
            auVar110._0_4_ = -(uint)(auVar88._0_4_ <= auVar44._0_4_);
            auVar110._8_4_ = -(uint)(auVar88._8_4_ <= auVar44._8_4_);
            auVar110._12_4_ = -(uint)(auVar88._12_4_ <= auVar44._12_4_);
            uVar20 = movmskps((int)valid_i,auVar110);
            valid_i = (vint<4> *)(ulong)uVar20;
            sVar26 = sVar25;
            if (uVar20 != 0) {
              sVar26 = *(size_t *)(sVar28 + lVar5 * 8);
              if (sVar25 != 8) {
                (pSVar27->ptr).ptr = sVar25;
                pSVar27->mask = uVar22;
                pSVar27 = pSVar27 + 1;
              }
              uVar22 = (ulong)valid_i & 0xff;
            }
            uVar1 = uVar31 - 1;
            uVar31 = uVar31 & uVar1;
            sVar25 = sVar26;
          } while (uVar31 != 0);
          This = (Intersectors *)CONCAT71((int7)(uVar1 >> 8),sVar26 != 8);
          sVar28 = sVar26;
        }
      } while ((char)This != '\0');
    }
    pIVar23 = (Intersectors *)0x0;
    pSVar24 = pSVar27;
    goto LAB_00211da9;
  }
  goto LAB_00211dbf;
  while (uVar22 = local_1190 + 1, bVar36 = local_1190 < uVar31, local_1190 = uVar22, bVar36) {
LAB_00211c98:
    valid_i = (vint<4> *)&local_f88;
    This = (Intersectors *)&valid0;
    vVar144 = InstanceArrayIntersectorK<4>::occluded
                        ((vbool<4> *)valid_i,(Precalculations *)This,(RayK<4> *)&pre,
                         (RayQueryContext *)ray,(Primitive *)context);
    valid0.field_0.i[0] = ~local_f88.i[0] & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~local_f88.i[1] & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~local_f88.i[2] & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~local_f88.i[3] & valid0.field_0.i[3];
    iVar21 = movmskps(vVar144.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar22 = CONCAT44(vVar144.field_0._4_4_,iVar21);
    if (iVar21 == 0) break;
  }
LAB_00211cf7:
  auVar71._8_4_ = 0xffffffff;
  auVar71._0_8_ = 0xffffffffffffffff;
  auVar71._12_4_ = 0xffffffff;
  auVar141 = auVar141 | (undefined1  [16])valid0.field_0 ^ auVar71;
  local_1148 = ~auVar141 & local_1148;
  iVar21 = movmskps((int)uVar22,local_1148);
  pSVar24 = pSVar27;
  if (iVar21 == 0) {
    pIVar23 = (Intersectors *)CONCAT71((int7)(CONCAT44((int)(uVar22 >> 0x20),iVar21) >> 8),1);
  }
  else {
    local_1118 = (auVar141 ^ auVar71) & local_1118 | auVar141 & _DAT_01feba00;
    pIVar23 = (Intersectors *)0x0;
  }
LAB_00211da9:
  if ((char)pIVar23 != '\0') goto LAB_00211dbf;
  goto LAB_00211a6a;
LAB_00211dbf:
  pIVar23 = pIVar30;
  if (pIVar30 == (Intersectors *)0x0) {
    auVar59._0_4_ = -(uint)(local_1088 == -1);
    auVar59._4_4_ = -(uint)(iStack_1084 == -1);
    auVar59._8_4_ = -(uint)(iStack_1080 == -1);
    auVar59._12_4_ = -(uint)(iStack_107c == -1);
    *(undefined1 (*) [16])(ray + 0x80) =
         ~(auVar59 & auVar141) & *(undefined1 (*) [16])(ray + 0x80) |
         _DAT_01feba00 & auVar59 & auVar141;
    return;
  }
  goto LAB_002116a2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }